

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

uchar * objures(objucxdef *undoctx,uchar cmd,ushort siz)

{
  undefined2 uVar1;
  ushort uVar2;
  undefined1 *puVar3;
  short in_DX;
  undefined1 in_SIL;
  long in_RDI;
  uchar *p;
  ushort prv;
  char *in_stack_ffffffffffffffe8;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff2;
  undefined1 in_stack_fffffffffffffff6;
  
  uVar2 = in_DX + 3;
  if (*(ushort *)(in_RDI + 0x10) < uVar2) {
    errsigf((errcxdef *)
            CONCAT17(in_SIL,CONCAT16(in_stack_fffffffffffffff6,
                                     CONCAT24(uVar2,CONCAT22(in_stack_fffffffffffffff2,
                                                             in_stack_fffffffffffffff0)))),
            in_stack_ffffffffffffffe8,0);
  }
  if (*(short *)(in_RDI + 0x12) == *(short *)(in_RDI + 0x16)) {
    *(undefined2 *)(in_RDI + 0x14) = 0;
    *(undefined2 *)(in_RDI + 0x16) = 0;
    *(undefined2 *)(in_RDI + 0x12) = 0;
    *(undefined2 *)(in_RDI + 0x18) = 0;
  }
  else {
    if (*(ushort *)(in_RDI + 0x14) < *(ushort *)(in_RDI + 0x12)) {
      if ((int)(uint)uVar2 <=
          (int)((uint)*(ushort *)(in_RDI + 0x10) - (uint)*(ushort *)(in_RDI + 0x12)))
      goto LAB_0014bc5d;
      *(undefined2 *)(in_RDI + 0x18) = *(undefined2 *)(in_RDI + 0x16);
      *(undefined2 *)(in_RDI + 0x12) = 0;
    }
    while ((int)((uint)*(ushort *)(in_RDI + 0x14) - (uint)*(ushort *)(in_RDI + 0x12)) <
           (int)(uint)uVar2) {
      objutadv((objucxdef *)p);
      if (*(ushort *)(in_RDI + 0x14) <= *(ushort *)(in_RDI + 0x12)) {
        if ((int)(uint)uVar2 <=
            (int)((uint)*(ushort *)(in_RDI + 0x10) - (uint)*(ushort *)(in_RDI + 0x12))) break;
        *(undefined2 *)(in_RDI + 0x18) = *(undefined2 *)(in_RDI + 0x16);
        *(undefined2 *)(in_RDI + 0x12) = 0;
      }
    }
  }
LAB_0014bc5d:
  uVar1 = *(undefined2 *)(in_RDI + 0x16);
  *(undefined2 *)(in_RDI + 0x16) = *(undefined2 *)(in_RDI + 0x12);
  puVar3 = (undefined1 *)(in_RDI + 0x38 + (ulong)*(ushort *)(in_RDI + 0x12));
  *puVar3 = in_SIL;
  *(undefined2 *)(puVar3 + 1) = uVar1;
  *(short *)(in_RDI + 0x12) = *(short *)(in_RDI + 0x12) + 3;
  if (*(ushort *)(in_RDI + 0x18) < *(ushort *)(in_RDI + 0x16)) {
    *(undefined2 *)(in_RDI + 0x18) = *(undefined2 *)(in_RDI + 0x16);
  }
  return (uchar *)(in_RDI + 0x38 + (ulong)*(ushort *)(in_RDI + 0x12));
}

Assistant:

uchar *objures(objucxdef *undoctx, uchar cmd, ushort siz)
{
    ushort  prv;
    uchar  *p;
    
    /* adjust size to include header information */
    siz += 1 + sizeof(ushort);
    
    /* make sure there's enough room overall for the record */
    if (siz > undoctx->objucxsiz) errsig(undoctx->objucxerr, ERR_UNDOVF);
    
    /* if there's no information, reset buffers */
    if (undoctx->objucxhead == undoctx->objucxprv)
    {
        undoctx->objucxhead = undoctx->objucxprv = undoctx->objucxtail = 0;
        undoctx->objucxtop = 0;
        goto done;
    }
    
    /* if tail is below head, we can use to top of entire buffer */
    if (undoctx->objucxtail < undoctx->objucxhead)
    {
        /* if there's enough space left after head, we're done */
        if (undoctx->objucxsiz - undoctx->objucxhead >= siz)
            goto done;
        
        /* insufficient space:  wrap head down to bottom of buffer */
        undoctx->objucxtop = undoctx->objucxprv;            /* last was top */
        undoctx->objucxhead = 0;
    }
    
    /* head is below tail:  delete records until we have enough room */
    while (undoctx->objucxtail - undoctx->objucxhead < siz)
    {
        objutadv(undoctx);
        
        /* if the tail wrapped, advancing won't do any more good */
        if (undoctx->objucxtail <= undoctx->objucxhead)
        {
            /* if there's enough room at the top, we're done */
            if (undoctx->objucxsiz - undoctx->objucxhead >= siz)
                goto done;
            
            /* still not enough room; wrap the head this time */
            undoctx->objucxtop = undoctx->objucxprv;        /* last was top */
            undoctx->objucxhead = 0;
        }
    }
    
done:
    /* save back-link, and set objucxprv pointer to the new record */
    prv = undoctx->objucxprv;
    undoctx->objucxprv = undoctx->objucxhead;
    
    /* write the header:  command byte, back-link to previous record */
    p = &undoctx->objucxbuf[undoctx->objucxhead];
    *p++ = cmd;
    memcpy(p, &prv, sizeof(prv));
    
    /* advance the head pointer past the header */
    undoctx->objucxhead += 1 + sizeof(prv);
    
    /* set the high-water mark if we've exceeded the old one */
    if (undoctx->objucxprv > undoctx->objucxtop)
        undoctx->objucxtop = undoctx->objucxprv;

    /* return the reserved space */
    return &undoctx->objucxbuf[undoctx->objucxhead];
}